

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O3

void __thiscall
coro_io::
callback_awaitor_base<async_simple::Try<std::pair<std::error_code,unsigned_long>>,coro_io::callback_awaitor<async_simple::Try<std::pair<std::error_code,unsigned_long>>>>
::awaitor_handler::set_value<std::pair<std::error_code,unsigned_long>>
          (awaitor_handler *this,pair<std::error_code,_unsigned_long> *args)

{
  long lVar1;
  error_category *peVar2;
  _Variadic_union<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  local_28;
  undefined1 local_10;
  
  local_28._16_8_ = args->second;
  local_28._M_rest._0_8_ = (undefined8)*(undefined8 *)&args->first;
  local_28._8_8_ = (args->first)._M_cat;
  local_10 = 1;
  lVar1 = *(long *)this;
  if (*(char *)(lVar1 + 0x20) == '\x01') {
    peVar2 = (args->first)._M_cat;
    *(undefined8 *)(lVar1 + 8) = *(undefined8 *)&args->first;
    *(error_category **)(lVar1 + 0x10) = peVar2;
    *(undefined8 *)(lVar1 + 0x18) = local_28._16_8_;
  }
  else {
    std::
    variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
    ::emplace<1ul,std::pair<std::error_code,unsigned_long>>
              ((variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                *)(lVar1 + 8),(pair<std::error_code,_unsigned_long> *)&local_28);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                       *)&local_28);
  return;
}

Assistant:

void set_value(Args &&...args) const {
      if constexpr (!std::is_void_v<Arg>) {
        obj->arg_ = {std::forward<Args>(args)...};
      }
    }